

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O2

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::invalidate(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this)

{
  SPxOut *pSVar1;
  Verbosity old_verbosity;
  undefined1 local_14 [4];
  
  if ((((this->factorized != false) || (this->matrixIsSetup == true)) &&
      (pSVar1 = this->spxout, pSVar1 != (SPxOut *)0x0)) && (4 < (int)pSVar1->m_verbosity)) {
    (*pSVar1->_vptr_SPxOut[2])();
    pSVar1 = soplex::operator<<(this->spxout,"ICHBAS09 explicit invalidation of factorization");
    std::endl<char,std::char_traits<char>>(pSVar1->m_streams[pSVar1->m_verbosity]);
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,local_14);
  }
  this->factorized = false;
  this->matrixIsSetup = false;
  return;
}

Assistant:

void SPxBasisBase<R>::invalidate()
{
   if(factorized || matrixIsSetup)
   {
      SPX_MSG_INFO3((*this->spxout),
                    (*this->spxout) << "ICHBAS09 explicit invalidation of factorization" <<
                    std::endl;)
   }

   factorized    = false;
   matrixIsSetup = false;
}